

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

archive_entry * archive_entry_clone(archive_entry *entry)

{
  void *p_00;
  archive_entry *in_RDI;
  void *p;
  size_t s;
  ae_sparse *sp;
  ae_xattr *xp;
  archive_entry *entry2;
  archive *in_stack_ffffffffffffffc8;
  archive_entry *in_stack_ffffffffffffffd0;
  archive_acl *in_stack_ffffffffffffffd8;
  ae_sparse *offset;
  archive_acl *in_stack_ffffffffffffffe0;
  archive_entry *paVar1;
  archive_entry *local_8;
  
  local_8 = archive_entry_new2(in_stack_ffffffffffffffc8);
  if (local_8 == (archive_entry *)0x0) {
    local_8 = (archive_entry *)0x0;
  }
  else {
    memcpy(&local_8->ae_stat,&in_RDI->ae_stat,0xa8);
    local_8->ae_fflags_set = in_RDI->ae_fflags_set;
    local_8->ae_fflags_clear = in_RDI->ae_fflags_clear;
    archive_mstring_copy
              ((archive_mstring *)in_stack_ffffffffffffffd0,
               (archive_mstring *)in_stack_ffffffffffffffc8);
    archive_mstring_copy
              ((archive_mstring *)in_stack_ffffffffffffffd0,
               (archive_mstring *)in_stack_ffffffffffffffc8);
    archive_mstring_copy
              ((archive_mstring *)in_stack_ffffffffffffffd0,
               (archive_mstring *)in_stack_ffffffffffffffc8);
    archive_mstring_copy
              ((archive_mstring *)in_stack_ffffffffffffffd0,
               (archive_mstring *)in_stack_ffffffffffffffc8);
    archive_mstring_copy
              ((archive_mstring *)in_stack_ffffffffffffffd0,
               (archive_mstring *)in_stack_ffffffffffffffc8);
    archive_mstring_copy
              ((archive_mstring *)in_stack_ffffffffffffffd0,
               (archive_mstring *)in_stack_ffffffffffffffc8);
    local_8->ae_set = in_RDI->ae_set;
    archive_mstring_copy
              ((archive_mstring *)in_stack_ffffffffffffffd0,
               (archive_mstring *)in_stack_ffffffffffffffc8);
    local_8->encryption = in_RDI->encryption;
    archive_acl_copy(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    p_00 = archive_entry_mac_metadata(in_RDI,(size_t *)&stack0xffffffffffffffd0);
    archive_entry_copy_mac_metadata(in_stack_ffffffffffffffd0,p_00,0x112237);
    for (paVar1 = (archive_entry *)in_RDI->xattr_head; paVar1 != (archive_entry *)0x0;
        paVar1 = (archive_entry *)paVar1->archive) {
      archive_entry_xattr_add_entry
                (paVar1,(char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,(size_t)p_00);
    }
    paVar1 = (archive_entry *)0x0;
    for (offset = in_RDI->sparse_head; offset != (ae_sparse *)0x0; offset = offset->next) {
      archive_entry_sparse_add_entry(paVar1,(int64_t)offset,(int64_t)in_stack_ffffffffffffffd0);
    }
  }
  return local_8;
}

Assistant:

struct archive_entry *
archive_entry_clone(struct archive_entry *entry)
{
	struct archive_entry *entry2;
	struct ae_xattr *xp;
	struct ae_sparse *sp;
	size_t s;
	const void *p;

	/* Allocate new structure and copy over all of the fields. */
	/* TODO: Should we copy the archive over?  Or require a new archive
	 * as an argument? */
	entry2 = archive_entry_new2(entry->archive);
	if (entry2 == NULL)
		return (NULL);
	entry2->ae_stat = entry->ae_stat;
	entry2->ae_fflags_set = entry->ae_fflags_set;
	entry2->ae_fflags_clear = entry->ae_fflags_clear;

	/* TODO: XXX If clone can have a different archive, what do we do here if
	 * character sets are different? XXX */
	archive_mstring_copy(&entry2->ae_fflags_text, &entry->ae_fflags_text);
	archive_mstring_copy(&entry2->ae_gname, &entry->ae_gname);
	archive_mstring_copy(&entry2->ae_hardlink, &entry->ae_hardlink);
	archive_mstring_copy(&entry2->ae_pathname, &entry->ae_pathname);
	archive_mstring_copy(&entry2->ae_sourcepath, &entry->ae_sourcepath);
	archive_mstring_copy(&entry2->ae_symlink, &entry->ae_symlink);
	entry2->ae_set = entry->ae_set;
	archive_mstring_copy(&entry2->ae_uname, &entry->ae_uname);

	/* Copy encryption status */
	entry2->encryption = entry->encryption;
	
	/* Copy ACL data over. */
	archive_acl_copy(&entry2->acl, &entry->acl);

	/* Copy Mac OS metadata. */
	p = archive_entry_mac_metadata(entry, &s);
	archive_entry_copy_mac_metadata(entry2, p, s);

	/* Copy xattr data over. */
	xp = entry->xattr_head;
	while (xp != NULL) {
		archive_entry_xattr_add_entry(entry2,
		    xp->name, xp->value, xp->size);
		xp = xp->next;
	}

	/* Copy sparse data over. */
	sp = entry->sparse_head;
	while (sp != NULL) {
		archive_entry_sparse_add_entry(entry2,
		    sp->offset, sp->length);
		sp = sp->next;
	}

	return (entry2);
}